

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O0

void DisplayFunction54(Idx<Variable> variable,lua_State *L,int index,lua_Debug_54 *ar)

{
  bool bVar1;
  ArenaClass *pAVar2;
  ulong uVar3;
  char *pcVar4;
  string *psVar5;
  Variable *pVVar6;
  Idx<Variable> IVar7;
  uint local_1c8;
  string local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  undefined1 local_128 [8];
  Idx<Variable> source;
  allocator local_f1;
  string local_f0 [8];
  string sourceText;
  undefined1 local_b0 [8];
  Idx<Variable> ptr;
  char *paramName;
  int local_90;
  int paramIndex;
  int i;
  string showValue;
  int paramNum;
  allocator local_51;
  undefined1 local_50 [8];
  string what;
  lua_Debug_54 *ar_local;
  int index_local;
  lua_State *L_local;
  Idx<Variable> variable_local;
  
  variable_local._0_8_ = variable._arena;
  L_local._0_4_ = variable.Raw;
  if (ar->what != (char *)0x0) {
    pcVar4 = ar->what;
    what.field_2._8_8_ = ar;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_50,pcVar4,&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"Lua");
    if (bVar1) {
      if (*(byte *)(what.field_2._8_8_ + 0x3d) < 0xb) {
        local_1c8 = (uint)*(byte *)(what.field_2._8_8_ + 0x3d);
      }
      else {
        local_1c8 = 10;
      }
      showValue.field_2._8_4_ = local_1c8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&i,"function(",(allocator *)((long)&paramIndex + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)&paramIndex + 3));
      (*lua_pushvalue)(L,index);
      for (local_90 = 0; local_90 != showValue.field_2._8_4_; local_90 = local_90 + 1) {
        ptr._arena = (ArenaClass *)(*lua_getlocal)(L,(lua_Debug *)0x0,local_90 + 1);
        if ((ptr._arena != (ArenaClass *)0x0) &&
           (std::__cxx11::string::append((char *)&i), local_90 + 1 != showValue.field_2._8_4_)) {
          std::__cxx11::string::append((char *)&i);
        }
      }
      std::__cxx11::string::push_back((char)&i);
      pVVar6 = Idx<Variable>::operator->((Idx<Variable> *)&L_local);
      std::__cxx11::string::operator=((string *)&pVVar6->value,(string *)&i);
      pVVar6 = Idx<Variable>::operator->((Idx<Variable> *)&L_local);
      pVVar6->valueType = 9;
      pVVar6 = Idx<Variable>::operator->((Idx<Variable> *)&L_local);
      std::__cxx11::string::operator=((string *)&pVVar6->valueTypeName,"function");
      pAVar2 = Idx<Variable>::GetArena((Idx<Variable> *)&L_local);
      IVar7 = Arena<Variable>::Alloc(pAVar2);
      ptr._0_8_ = IVar7._arena;
      local_b0._0_4_ = IVar7.Raw;
      pVVar6 = Idx<Variable>::operator->((Idx<Variable> *)local_b0);
      pVVar6->nameType = 4;
      pVVar6 = Idx<Variable>::operator->((Idx<Variable> *)local_b0);
      pVVar6->valueType = 6;
      pVVar6 = Idx<Variable>::operator->((Idx<Variable> *)local_b0);
      std::__cxx11::string::operator=((string *)&pVVar6->name,"pointer");
      ToPointer_abi_cxx11_((string *)((long)&sourceText.field_2 + 8),L,index);
      pVVar6 = Idx<Variable>::operator->((Idx<Variable> *)local_b0);
      std::__cxx11::string::operator=
                ((string *)&pVVar6->value,(string *)(sourceText.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(sourceText.field_2._M_local_buf + 8));
      if (*(long *)(what.field_2._8_8_ + 0x20) != 0) {
        pcVar4 = *(char **)(what.field_2._8_8_ + 0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f0,pcVar4,&local_f1);
        std::allocator<char>::~allocator((allocator<char> *)&local_f1);
        uVar3 = std::__cxx11::string::empty();
        if (((uVar3 & 1) == 0) && (pcVar4 = (char *)std::__cxx11::string::front(), *pcVar4 == '@'))
        {
          std::__cxx11::string::substr((ulong)&source._arena,(ulong)local_f0);
          std::__cxx11::string::operator=(local_f0,(string *)&source._arena);
          std::__cxx11::string::~string((string *)&source._arena);
        }
        pAVar2 = Idx<Variable>::GetArena((Idx<Variable> *)&L_local);
        IVar7 = Arena<Variable>::Alloc(pAVar2);
        source._0_8_ = IVar7._arena;
        local_128._0_4_ = IVar7.Raw;
        pVVar6 = Idx<Variable>::operator->((Idx<Variable> *)local_128);
        pVVar6->nameType = 4;
        pVVar6 = Idx<Variable>::operator->((Idx<Variable> *)local_128);
        pVVar6->valueType = 4;
        pVVar6 = Idx<Variable>::operator->((Idx<Variable> *)local_128);
        std::__cxx11::string::operator=((string *)&pVVar6->name,"source");
        psVar5 = (string *)std::__cxx11::string::append((char *)local_f0);
        std::__cxx11::to_string(&local_148,*(int *)(what.field_2._8_8_ + 0x34));
        psVar5 = (string *)std::__cxx11::string::append(psVar5);
        pVVar6 = Idx<Variable>::operator->((Idx<Variable> *)local_128);
        std::__cxx11::string::operator=((string *)&pVVar6->value,psVar5);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string(local_f0);
      }
      std::__cxx11::string::~string((string *)&i);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_50,"C");
      if (bVar1) {
        ToPointer_abi_cxx11_(&local_188,L,index);
        std::operator+(&local_168,"C ",&local_188);
        pVVar6 = Idx<Variable>::operator->((Idx<Variable> *)&L_local);
        std::__cxx11::string::operator=((string *)&pVVar6->value,(string *)&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_188);
      }
      else {
        ToPointer_abi_cxx11_(&local_1a8,L,index);
        pVVar6 = Idx<Variable>::operator->((Idx<Variable> *)&L_local);
        std::__cxx11::string::operator=((string *)&pVVar6->value,(string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void DisplayFunction54(Idx<Variable> variable, lua_State *L, int index, lua_Debug_54 &ar) {
	if (ar.what == nullptr) {
		return;
	}
	std::string what = ar.what;
	if (what == "Lua") {
		auto paramNum = ar.nparams > 10 ? 10 : ar.nparams;
		std::string showValue = "function(";
		lua_pushvalue(L, index);
		for (auto i = 0; i != paramNum; i++) {
			auto paramIndex = i + 1;
			auto paramName = lua_getlocal(L, nullptr, paramIndex);
			if (paramName) {
				showValue.append(paramName);
				if (paramIndex != paramNum) {
					showValue.append(", ");
				}
			}
		}
		showValue.push_back(')');
		variable->value = showValue;
		variable->valueType = 9;
		variable->valueTypeName = "function";
		// ptr
		auto ptr = variable.GetArena()->Alloc();
		ptr->nameType = LUA_TSTRING;
		ptr->valueType = LUA_TFUNCTION;
		ptr->name = "pointer";
		ptr->value = ToPointer(L, index);

		// source
		if (ar.source) {
			std::string sourceText = ar.source;
			if (!sourceText.empty() && sourceText.front() == '@') {
				sourceText = sourceText.substr(1);
			}
			auto source = variable.GetArena()->Alloc();
			source->nameType = LUA_TSTRING;
			source->valueType = LUA_TSTRING;
			source->name = "source";
			source->value = sourceText.append(":").append(std::to_string(ar.linedefined));
		}
	} else if (what == "C") {
		variable->value = "C " + ToPointer(L, index);
	} else {
		variable->value = ToPointer(L, index);
		return;
	}
}